

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O0

hts_idx_t * hts_idx_load_local(char *fn,int fmt)

{
  int iVar1;
  ssize_t sVar2;
  ulong uVar3;
  uint8_t *puVar4;
  FILE *__stream;
  size_t sVar5;
  FILE *fp_2;
  int local_78;
  uint32_t n_1;
  uint32_t x_1 [8];
  BGZF *fp_1;
  uint8_t *meta;
  uint32_t n;
  uint32_t x [3];
  BGZF *fp;
  hts_idx_t *idx;
  int is_be;
  int i;
  uint8_t magic [4];
  int fmt_local;
  char *fn_local;
  
  fp = (BGZF *)0x0;
  i = fmt;
  _magic = fn;
  iVar1 = ed_is_big();
  if (i == 0) {
    fp_1 = (BGZF *)0x0;
    x._4_8_ = bgzf_open(_magic,"r");
    if ((BGZF *)x._4_8_ != (BGZF *)0x0) {
      sVar2 = bgzf_read((BGZF *)x._4_8_,&is_be,4);
      if (((sVar2 == 4) && (is_be == 0x1495343)) &&
         (sVar2 = bgzf_read((BGZF *)x._4_8_,(void *)((long)&meta + 4),0xc), sVar2 == 0xc)) {
        if (iVar1 != 0) {
          for (idx._4_4_ = 0; idx._4_4_ < 3; idx._4_4_ = idx._4_4_ + 1) {
            ed_swap_4p((void *)((long)&meta + (long)idx._4_4_ * 4 + 4));
          }
        }
        if (((x[0] == 0) ||
            ((fp_1 = (BGZF *)malloc((ulong)x[0]), fp_1 != (BGZF *)0x0 &&
             (uVar3 = bgzf_read((BGZF *)x._4_8_,fp_1,(ulong)x[0]), uVar3 == x[0])))) &&
           (sVar2 = bgzf_read((BGZF *)x._4_8_,&meta,4), sVar2 == 4)) {
          if (iVar1 != 0) {
            ed_swap_4p(&meta);
          }
          fp = (BGZF *)hts_idx_init((int)meta,i,0,meta._4_4_,n);
          if ((hts_idx_t *)fp != (hts_idx_t *)0x0) {
            ((hts_idx_t *)fp)->l_meta = x[0];
            ((hts_idx_t *)fp)->meta = (uint8_t *)fp_1;
            fp_1 = (BGZF *)0x0;
            iVar1 = hts_idx_load_core((hts_idx_t *)fp,(void *)x._4_8_,0);
            if (-1 < iVar1) {
              bgzf_close((BGZF *)x._4_8_);
              return (hts_idx_t *)fp;
            }
          }
        }
      }
      bgzf_close((BGZF *)x._4_8_);
      hts_idx_destroy((hts_idx_t *)fp);
      free(fp_1);
    }
  }
  else if (i == 2) {
    x_1._24_8_ = bgzf_open(_magic,"r");
    if ((BGZF *)x_1._24_8_ != (BGZF *)0x0) {
      sVar2 = bgzf_read((BGZF *)x_1._24_8_,&is_be,4);
      if (((sVar2 == 4) && (is_be == 0x1494254)) &&
         (sVar2 = bgzf_read((BGZF *)x_1._24_8_,&local_78,0x20), sVar2 == 0x20)) {
        if (iVar1 != 0) {
          for (idx._4_4_ = 0; idx._4_4_ < 8; idx._4_4_ = idx._4_4_ + 1) {
            ed_swap_4p(&local_78 + idx._4_4_);
          }
        }
        fp = (BGZF *)hts_idx_init(local_78,i,0,0xe,5);
        if ((hts_idx_t *)fp != (hts_idx_t *)0x0) {
          ((hts_idx_t *)fp)->l_meta = x_1[5] + 0x1c;
          puVar4 = (uint8_t *)malloc((ulong)((hts_idx_t *)fp)->l_meta);
          ((hts_idx_t *)fp)->meta = puVar4;
          if (puVar4 != (uint8_t *)0x0) {
            puVar4 = ((hts_idx_t *)fp)->meta;
            *(undefined8 *)puVar4 = _n_1;
            *(undefined8 *)(puVar4 + 8) = x_1._4_8_;
            *(undefined8 *)(puVar4 + 0x10) = x_1._12_8_;
            *(uint32_t *)(puVar4 + 0x18) = x_1[5];
            uVar3 = bgzf_read((BGZF *)x_1._24_8_,((hts_idx_t *)fp)->meta + 0x1c,(ulong)x_1[5]);
            if ((uVar3 == x_1[5]) &&
               (iVar1 = hts_idx_load_core((hts_idx_t *)fp,(void *)x_1._24_8_,2), -1 < iVar1)) {
              bgzf_close((BGZF *)x_1._24_8_);
              return (hts_idx_t *)fp;
            }
          }
        }
      }
      bgzf_close((BGZF *)x_1._24_8_);
      hts_idx_destroy((hts_idx_t *)fp);
    }
  }
  else {
    if (i != 1) {
      abort();
    }
    __stream = fopen(_magic,"rb");
    if (__stream != (FILE *)0x0) {
      sVar5 = fread(&is_be,1,4,__stream);
      if (((sVar5 == 4) && (is_be == 0x1494142)) &&
         (sVar5 = fread((void *)((long)&fp_2 + 4),4,1,__stream), sVar5 == 1)) {
        if (iVar1 != 0) {
          ed_swap_4p((void *)((long)&fp_2 + 4));
        }
        fp = (BGZF *)hts_idx_init(fp_2._4_4_,i,0,0xe,5);
        iVar1 = hts_idx_load_core((hts_idx_t *)fp,__stream,1);
        if (-1 < iVar1) {
          fclose(__stream);
          return (hts_idx_t *)fp;
        }
      }
      fclose(__stream);
      hts_idx_destroy((hts_idx_t *)fp);
    }
  }
  return (hts_idx_t *)0x0;
}

Assistant:

hts_idx_t *hts_idx_load_local(const char *fn, int fmt)
{
    uint8_t magic[4];
    int i, is_be;
    hts_idx_t *idx = NULL;
    is_be = ed_is_big();
    if (fmt == HTS_FMT_CSI) {
        BGZF *fp;
        uint32_t x[3], n;
        uint8_t *meta = 0;
        if ((fp = bgzf_open(fn, "r")) == 0) return NULL;
        if (bgzf_read(fp, magic, 4) != 4) goto csi_fail;
        if (memcmp(magic, "CSI\1", 4) != 0) goto csi_fail;
        if (bgzf_read(fp, x, 12) != 12) goto csi_fail;
        if (is_be) for (i = 0; i < 3; ++i) ed_swap_4p(&x[i]);
        if (x[2]) {
            if ((meta = (uint8_t*)malloc(x[2])) == NULL) goto csi_fail;
            if (bgzf_read(fp, meta, x[2]) != x[2]) goto csi_fail;
        }
        if (bgzf_read(fp, &n, 4) != 4) goto csi_fail;
        if (is_be) ed_swap_4p(&n);
        if ((idx = hts_idx_init(n, fmt, 0, x[0], x[1])) == NULL) goto csi_fail;
        idx->l_meta = x[2];
        idx->meta = meta;
        meta = NULL;
        if (hts_idx_load_core(idx, fp, HTS_FMT_CSI) < 0) goto csi_fail;
        bgzf_close(fp);
        return idx;

    csi_fail:
        bgzf_close(fp);
        hts_idx_destroy(idx);
        free(meta);
        return NULL;

    } else if (fmt == HTS_FMT_TBI) {
        BGZF *fp;
        uint32_t x[8];
        if ((fp = bgzf_open(fn, "r")) == 0) return NULL;
        if (bgzf_read(fp, magic, 4) != 4) goto tbi_fail;
        if (memcmp(magic, "TBI\1", 4) != 0) goto tbi_fail;
        if (bgzf_read(fp, x, 32) != 32) goto tbi_fail;
        if (is_be) for (i = 0; i < 8; ++i) ed_swap_4p(&x[i]);
        if ((idx = hts_idx_init(x[0], fmt, 0, 14, 5)) == NULL) goto tbi_fail;
        idx->l_meta = 28 + x[7];
        if ((idx->meta = (uint8_t*)malloc(idx->l_meta)) == NULL) goto tbi_fail;
        memcpy(idx->meta, &x[1], 28);
        if (bgzf_read(fp, idx->meta + 28, x[7]) != x[7]) goto tbi_fail;
        if (hts_idx_load_core(idx, fp, HTS_FMT_TBI) < 0) goto tbi_fail;
        bgzf_close(fp);
        return idx;

    tbi_fail:
        bgzf_close(fp);
        hts_idx_destroy(idx);
        return NULL;

    } else if (fmt == HTS_FMT_BAI) {
        uint32_t n;
        FILE *fp;
        if ((fp = fopen(fn, "rb")) == 0) return NULL;
        if (fread(magic, 1, 4, fp) != 4) goto bai_fail;
        if (memcmp(magic, "BAI\1", 4) != 0) goto bai_fail;
        if (fread(&n, 4, 1, fp) != 1) goto bai_fail;
        if (is_be) ed_swap_4p(&n);
        idx = hts_idx_init(n, fmt, 0, 14, 5);
        if (hts_idx_load_core(idx, fp, HTS_FMT_BAI) < 0) goto bai_fail;
        fclose(fp);
        return idx;

    bai_fail:
        fclose(fp);
        hts_idx_destroy(idx);
        return NULL;

    } else abort();
}